

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

void LEARNER::generic_driver_onethread(vw *all)

{
  multi_ex ctxt;
  _Vector_base<example_*,_std::allocator<example_*>_> local_68;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  if (all->l[0xe8] == (base_learner)0x1) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_28._8_8_ = 0;
    local_10 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/learner.cc:224:26)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/learner.cc:224:26)>
               ::_M_manager;
    local_28._M_unused._M_object = &local_68;
    parse_dispatch(all,(dispatch_fptr *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    on_new_partial_ex<&LEARNER::process_multi_ex>((example *)0x0,(multi_ex *)&local_68,all);
    std::_Vector_base<example_*,_std::allocator<example_*>_>::~_Vector_base(&local_68);
  }
  else {
    local_48[1] = (code *)0x0;
    local_48[0] = dispatch;
    local_30 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(vw_&,_v_array<example_*>_&),_void_(*)(vw_&,_v_array<example_*>)>
               ::_M_manager;
    parse_dispatch(all,(dispatch_fptr *)local_48);
    std::_Function_base::~_Function_base((_Function_base *)local_48);
  }
  learner<char,_char>::end_examples(all->l);
  return;
}

Assistant:

void generic_driver_onethread(vw& all)
{
  if (all.l->is_multiline)
  {
    multi_ex ctxt;
    auto multi_ex_fptr = [&ctxt](vw& all, v_array<example*> examples) {
      all.p->end_parsed_examples += examples.size();  // divergence: lock & signal
      for (size_t i = 0; i < examples.size(); ++i) on_new_partial_ex<process_multi_ex>(examples[i], ctxt, all);
    };

    parse_dispatch(all, multi_ex_fptr);

    // flush accumulated examples if there is no newline
    // at the end of the file
    on_new_partial_ex<process_multi_ex>(nullptr, ctxt, all);
  }
  else
    parse_dispatch(all, dispatch);

  all.l->end_examples();
}